

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_rando_world_edits.hpp
# Opt level: O2

void PatchRandoWorldEdits::put_back_golems_in_lake_shrine_keydoor_map(World *world)

{
  pointer pGVar1;
  Map *this;
  Entity *pEVar2;
  EntityMaskFlag local_10;
  
  this = World::map(world,0x132);
  pGVar1 = (this->_global_entity_mask_flags).
           super__Vector_base<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_global_entity_mask_flags).
      super__Vector_base<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>._M_impl.
      super__Vector_impl_data._M_finish != pGVar1) {
    (this->_global_entity_mask_flags).
    super__Vector_base<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>._M_impl.
    super__Vector_impl_data._M_finish = pGVar1;
  }
  pGVar1 = (this->_key_door_mask_flags).
           super__Vector_base<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_key_door_mask_flags).
      super__Vector_base<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>._M_impl.
      super__Vector_impl_data._M_finish != pGVar1) {
    (this->_key_door_mask_flags).
    super__Vector_base<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>._M_impl.
    super__Vector_impl_data._M_finish = pGVar1;
  }
  pEVar2 = Map::entity(this,'\x04');
  local_10.super_Flag.byte = 7;
  local_10.super_Flag.bit = '\x05';
  local_10.super_Flag._11_1_ = 0;
  local_10.super_Flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00246e68;
  std::vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::emplace_back<EntityMaskFlag>
            (&(pEVar2->_attrs).mask_flags,&local_10);
  return;
}

Assistant:

static void put_back_golems_in_lake_shrine_keydoor_map(World& world)
    {
        Map* map = world.map(MAP_LAKE_SHRINE_0F_KEYDOOR);
        map->global_entity_mask_flags().clear();
        map->key_door_mask_flags().clear();
        map->entity(4)->mask_flags().emplace_back(EntityMaskFlag(false, 7, 5));
    }